

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_post_effects.cpp
# Opt level: O2

bool __thiscall ON_PostEffect::operator==(ON_PostEffect *this,ON_PostEffect *pep)

{
  bool bVar1;
  bool bVar2;
  ON_XMLParameters *this_00;
  CIterator *this_01;
  wchar_t *name;
  ON_wString param_name;
  ON_PostEffectParams p2;
  ON_PostEffectParams p1;
  ON_XMLVariant param_value2;
  ON_XMLVariant param_value1;
  ON_wString OStack_248;
  ON_PostEffectParams local_240;
  ON_PostEffectParams local_230;
  ON_XMLVariant local_220;
  ON_XMLVariant local_128;
  
  bVar1 = ::operator!=(&this->_impl->_id,&pep->_impl->_id);
  if (!bVar1) {
    if ((this->_impl->_type == pep->_impl->_type) &&
       (bVar1 = ::operator!=(&this->_impl->_local_name,&pep->_impl->_local_name), !bVar1)) {
      ON_PostEffectParams::ON_PostEffectParams(&local_230);
      ON_PostEffectParams::ON_PostEffectParams(&local_240);
      (*this->_vptr_ON_PostEffect[0xe])(this,&local_230);
      (*pep->_vptr_ON_PostEffect[0xe])(pep,&local_240);
      this_00 = ON_PostEffectParams::CImpl::AsXMLParameters(local_230._impl);
      this_01 = ON_XMLParameters::NewIterator(this_00);
      ON_wString::ON_wString(&OStack_248);
      ::ON_XMLVariant::ON_XMLVariant(&local_128);
      ::ON_XMLVariant::ON_XMLVariant(&local_220);
      bVar1 = true;
      while ((bVar1 != false &&
             (bVar2 = ON_XMLParameters::CIterator::Next(this_01,&OStack_248,&local_128), bVar2))) {
        name = ON_wString::operator_cast_to_wchar_t_(&OStack_248);
        bVar1 = ON_PostEffectParams::GetParam(&local_240,name,&local_220);
        bVar2 = ::ON_XMLVariant::operator!=(&local_128,&local_220);
        bVar1 = bVar1 && !bVar2;
      }
      if (this_01 != (CIterator *)0x0) {
        (*this_01->_vptr_CIterator[1])(this_01);
      }
      ::ON_XMLVariant::~ON_XMLVariant(&local_220);
      ::ON_XMLVariant::~ON_XMLVariant(&local_128);
      ON_wString::~ON_wString(&OStack_248);
      ON_PostEffectParams::~ON_PostEffectParams(&local_240);
      ON_PostEffectParams::~ON_PostEffectParams(&local_230);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool ON_PostEffect::operator == (const ON_PostEffect& pep) const
{
  if (_impl->_id         != pep._impl->_id)         return false;
  if (_impl->_type       != pep._impl->_type)       return false;
  if (_impl->_local_name != pep._impl->_local_name) return false;

  ON_PostEffectParams p1, p2;
  GetAllParameters(p1);
  pep.GetAllParameters(p2);

  bool equal = true;
  auto* it = p1.AsXMLParameters().NewIterator();

  ON_wString param_name;
  ON_XMLVariant param_value1, param_value2;
  while (equal && it->Next(param_name, param_value1))
  {
    if (!p2.GetParam(param_name, param_value2))
      equal = false;

    if (param_value1 != param_value2)
      equal = false;
  }

  delete it;

  return equal;
}